

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_etc.c
# Opt level: O1

void zzAddAndW(word *b,word *a,size_t n,word w)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (n != 0) {
    sVar4 = 0;
    uVar5 = 0;
    do {
      uVar3 = a[sVar4];
      uVar6 = (uVar3 & w) + uVar5;
      puVar1 = b + sVar4;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar6;
      uVar5 = (ulong)(CARRY8(uVar2,uVar6) || CARRY8(uVar3 & w,uVar5));
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
  }
  return;
}

Assistant:

void zzAddAndW(word b[], const word a[], size_t n, register word w)
{
	register word carry = 0;
	register word prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		prod = w & a[i];
		prod += carry;
		carry = wordLess01(prod, carry);
		b[i] += prod;
		carry |= wordLess01(b[i], prod);
	}
	prod = w = carry = 0;
}